

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pdf_unicode.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_b8 [32];
  string local_98 [48];
  undefined1 local_68 [8];
  QPDFObjectHandle str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  char *infilename;
  char **argv_local;
  int argc_local;
  
  pcVar2 = strrchr(*argv,0x2f);
  if (pcVar2 == (char *)0x0) {
    whoami = *argv;
  }
  else {
    whoami = pcVar2 + 1;
  }
  if (argc != 2) {
    usage();
  }
  QUtil::read_lines_from_file_abi_cxx11_((char *)&__begin1,SUB81(argv[1],0));
  __end1 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin1);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&line);
    if (!bVar1) break;
    str.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            std::
            _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&__end1);
    QPDFObjectHandle::newUnicodeString((string *)local_68);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_();
    poVar3 = std::operator<<((ostream *)&std::cout,local_98);
    poVar3 = std::operator<<(poVar3," // ");
    QPDFObjectHandle::unparseBinary_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_b8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_98);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_68);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__begin1);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    if (argc != 2) {
        usage();
    }
    char const* infilename = argv[1];
    for (auto const& line: QUtil::read_lines_from_file(infilename)) {
        QPDFObjectHandle str = QPDFObjectHandle::newUnicodeString(line);
        std::cout << str.getUTF8Value() << " // " << str.unparseBinary() << std::endl;
    }
    return 0;
}